

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O1

int co_poll_inner(stCoEpoll_t *ctx,pollfd *fds,nfds_t nfds,int timeout,poll_pfn_t pollfunc)

{
  uint *puVar1;
  stCoRoutine_t *pending_co;
  stCoRoutine_t *curr;
  uint uVar2;
  int iVar3;
  int iVar4;
  stTimeoutItem_t *apItem;
  stTimeoutItem_t *psVar5;
  stTimeoutItemLink_t *psVar6;
  int *piVar7;
  unsigned_long_long allNow;
  long lVar8;
  long lVar9;
  ulong uVar10;
  nfds_t nVar11;
  long in_FS_OFFSET;
  bool bVar12;
  bool bVar13;
  timeval now;
  stPollItem_t arr [2];
  long local_130;
  int local_124;
  timeval local_108;
  stTimeoutItemLink_t local_f8 [12];
  
  if (timeout == 0) {
    iVar3 = (*pollfunc)(fds,nfds,0);
    return iVar3;
  }
  uVar2 = 0x7fffffff;
  if ((uint)timeout < 0x7fffffff) {
    uVar2 = timeout;
  }
  iVar3 = ctx->iEpollFd;
  lVar8 = *(long *)(in_FS_OFFSET + -0x10);
  if (lVar8 == 0) {
    lVar9 = 0;
  }
  else {
    lVar9 = *(long *)(lVar8 + -8 + (long)*(int *)(lVar8 + 0x400) * 8);
  }
  apItem = (stTimeoutItem_t *)malloc(0x68);
  apItem[1].pLink = (stTimeoutItemLink_t *)0x0;
  apItem[1].ullExpireTime = 0;
  apItem->pPrev = (stTimeoutItem_t *)0x0;
  apItem->pNext = (stTimeoutItem_t *)0x0;
  apItem->pLink = (stTimeoutItemLink_t *)0x0;
  apItem->ullExpireTime = 0;
  apItem->pfnPrepare = (OnPreparePfn_t)0x0;
  apItem->pfnProcess = (OnProcessPfn_t)0x0;
  apItem->pArg = (void *)0x0;
  *(undefined8 *)&apItem->bTimeout = 0;
  apItem[1].pPrev = (stTimeoutItem_t *)0x0;
  apItem[1].pNext = (stTimeoutItem_t *)0x0;
  apItem[1].pfnPrepare = (OnPreparePfn_t)0x0;
  *(int *)((long)&apItem[1].ullExpireTime + 4) = iVar3;
  psVar5 = (stTimeoutItem_t *)calloc(nfds,8);
  apItem[1].pPrev = psVar5;
  apItem[1].pNext = (stTimeoutItem_t *)nfds;
  if ((1 < nfds) || (psVar6 = local_f8, *(char *)(lVar9 + 0x9c) != '\0')) {
    psVar6 = (stTimeoutItemLink_t *)malloc(nfds * 0x60);
  }
  apItem[1].pLink = psVar6;
  memset(psVar6,0,nfds * 0x60);
  apItem->pfnProcess = OnPollProcessEvent;
  apItem->pArg = *(void **)(lVar8 + -8 + (long)*(int *)(lVar8 + 0x400) * 8);
  bVar12 = nfds != 0;
  if (nfds == 0) {
    local_130 = 0;
  }
  else {
    lVar9 = 0x50;
    lVar8 = 0;
    local_130 = 0;
    uVar10 = 1;
    do {
      psVar6 = apItem[1].pLink;
      *(long *)((long)&psVar6[-1].head + lVar9) = (long)&(apItem[1].pPrev)->pPrev + lVar8;
      *(stTimeoutItem_t **)((long)psVar6 + lVar9 + -8) = apItem;
      *(code **)((long)&psVar6[-3].head + lVar9) = OnPollPreparePfn;
      bVar13 = true;
      if (-1 < fds[uVar10 - 1].fd) {
        puVar1 = (uint *)((long)&psVar6->head + lVar9);
        *(uint **)(puVar1 + 1) = puVar1 + -0x14;
        *puVar1 = (ushort)fds[uVar10 - 1].events & 0x15d;
        iVar4 = co_epoll_ctl(iVar3,1,fds[uVar10 - 1].fd,(epoll_event *)((long)&psVar6->head + lVar9)
                            );
        if ((((iVar4 < 0) && (piVar7 = __errno_location(), pollfunc != (poll_pfn_t)0x0)) &&
            (nfds == 1)) && (*piVar7 == 1)) {
          if (apItem[1].pLink != local_f8) {
            free(apItem[1].pLink);
            apItem[1].pLink = (stTimeoutItemLink_t *)0x0;
          }
          free(apItem[1].pPrev);
          free(apItem);
          local_124 = (*pollfunc)(fds,1,uVar2);
          bVar13 = false;
        }
        else {
          local_130 = local_130 + 1;
        }
      }
      if (!bVar13) break;
      bVar12 = uVar10 < nfds;
      lVar9 = lVar9 + 0x60;
      lVar8 = lVar8 + 8;
      bVar13 = uVar10 != nfds;
      uVar10 = uVar10 + 1;
    } while (bVar13);
  }
  if (!bVar12) {
    local_108.tv_sec = 0;
    local_108.tv_usec = 0;
    gettimeofday(&local_108,(__timezone_ptr_t)0x0);
    allNow = local_108.tv_usec / 1000 + local_108.tv_sec * 1000;
    apItem->ullExpireTime = uVar2 + allNow;
    iVar4 = AddTimeout(ctx->pTimeout,apItem,allNow);
    if (iVar4 == 0) {
      *(long *)(in_FS_OFFSET + -8) = *(long *)(in_FS_OFFSET + -8) + local_130;
      lVar8 = *(long *)(in_FS_OFFSET + -0x10);
      iVar4 = *(int *)(lVar8 + 0x400);
      pending_co = *(stCoRoutine_t **)(lVar8 + -0x10 + (long)iVar4 * 8);
      curr = *(stCoRoutine_t **)(lVar8 + -8 + (long)iVar4 * 8);
      *(int *)(lVar8 + 0x400) = iVar4 + -1;
      co_swap(curr,pending_co);
      *(long *)(in_FS_OFFSET + -8) = *(long *)(in_FS_OFFSET + -8) - local_130;
      local_124 = *(int *)&apItem[1].pfnPrepare;
    }
    else {
      piVar7 = __errno_location();
      *piVar7 = 0x16;
      local_124 = -1;
    }
    RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>(apItem);
    if (nfds != 0) {
      lVar8 = 0x50;
      nVar11 = 0;
      do {
        if (-1 < fds[nVar11].fd) {
          co_epoll_ctl(iVar3,2,fds[nVar11].fd,
                       (epoll_event *)((long)&(apItem[1].pLink)->head + lVar8));
        }
        fds[nVar11].revents = *(short *)((long)&(apItem[1].pPrev)->pPrev + nVar11 * 8 + 6);
        nVar11 = nVar11 + 1;
        lVar8 = lVar8 + 0x60;
      } while (nfds != nVar11);
    }
    if (apItem[1].pLink != local_f8) {
      free(apItem[1].pLink);
      apItem[1].pLink = (stTimeoutItemLink_t *)0x0;
    }
    free(apItem[1].pPrev);
    free(apItem);
  }
  return local_124;
}

Assistant:

int co_poll_inner( stCoEpoll_t *ctx,struct pollfd fds[], nfds_t nfds, int timeout, poll_pfn_t pollfunc)
{
    if (timeout == 0)
	{
		return pollfunc(fds, nfds, timeout);
	}
	if (timeout < 0)
	{
		timeout = INT_MAX;
	}
	int epfd = ctx->iEpollFd;
	stCoRoutine_t* self = co_self();

	//1.struct change
	stPoll_t& arg = *((stPoll_t*)malloc(sizeof(stPoll_t)));
	memset( &arg,0,sizeof(arg) );

	arg.iEpollFd = epfd;
	arg.fds = (pollfd*)calloc(nfds, sizeof(pollfd));
	arg.nfds = nfds;

	stPollItem_t arr[2];
	if( nfds < sizeof(arr) / sizeof(arr[0]) && !self->cIsShareStack)
	{
		arg.pPollItems = arr;
	}	
	else
	{
		arg.pPollItems = (stPollItem_t*)malloc( nfds * sizeof( stPollItem_t ) );
	}
	memset( arg.pPollItems,0,nfds * sizeof(stPollItem_t) );

	arg.pfnProcess = OnPollProcessEvent;
	arg.pArg = GetCurrCo( co_get_curr_thread_env() );
	
	size_t num_active = 0;
	//2. add epoll
	for(nfds_t i=0;i<nfds;i++)
	{
		arg.pPollItems[i].pSelf = arg.fds + i;
		arg.pPollItems[i].pPoll = &arg;

		arg.pPollItems[i].pfnPrepare = OnPollPreparePfn;
		struct epoll_event &ev = arg.pPollItems[i].stEvent;

		if( fds[i].fd > -1 )
		{
			ev.data.ptr = arg.pPollItems + i;
			ev.events = PollEvent2Epoll( fds[i].events );

			int ret = co_epoll_ctl( epfd,EPOLL_CTL_ADD, fds[i].fd, &ev );
			if (ret < 0 && errno == EPERM && nfds == 1 && pollfunc != NULL)
			{
				if( arg.pPollItems != arr )
				{
					free( arg.pPollItems );
					arg.pPollItems = NULL;
				}
				free(arg.fds);
				free(&arg);
				return pollfunc(fds, nfds, timeout);
			}
			num_active++;
		}
		//if fail,the timeout would work
	}

	//3.add timeout

	unsigned long long now = GetTickMS();
	arg.ullExpireTime = now + timeout;
	int ret = AddTimeout( ctx->pTimeout,&arg,now );
	int iRaiseCnt = 0;
	if( ret != 0 && ret!=-1){
		co_log_err("CO_ERR: AddTimeout ret %d now %lld timeout %d arg.ullExpireTime %lld",
				ret,now,timeout,arg.ullExpireTime);
		errno = EINVAL;
		iRaiseCnt = -1;

	}
    else
	{
		_num_co_routines_active += num_active;
		co_yield_env( co_get_curr_thread_env() );
		_num_co_routines_active -= num_active;
		iRaiseCnt = arg.iRaiseCnt;
	}

    {
		//clear epoll status and memory
		RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>( &arg );
		for(nfds_t i = 0;i < nfds;i++)
		{
			int fd = fds[i].fd;
			if( fd > -1 )
			{
				co_epoll_ctl( epfd,EPOLL_CTL_DEL,fd,&arg.pPollItems[i].stEvent );
			}
			fds[i].revents = arg.fds[i].revents;
		}


		if( arg.pPollItems != arr )
		{
			free( arg.pPollItems );
			arg.pPollItems = NULL;
		}

		free(arg.fds);
		free(&arg);
	}

	return iRaiseCnt;
}